

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MallocV.cpp
# Opt level: O0

void __thiscall
adios2::format::MallocV::MallocV
          (MallocV *this,string *type,bool AlwaysCopy,size_t MemAlign,size_t MemBlockSize,
          size_t InitialBufferSize,double GrowthFactor)

{
  string *in_RSI;
  undefined8 *in_RDI;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  string *this_00;
  size_t in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa7;
  string *in_stack_ffffffffffffffa8;
  BufferV *in_stack_ffffffffffffffb0;
  
  this_00 = (string *)&stack0xffffffffffffffa8;
  std::__cxx11::string::string(this_00,in_RSI);
  BufferV::BufferV(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                   (bool)in_stack_ffffffffffffffa7,in_stack_ffffffffffffff98,(size_t)this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  *in_RDI = &PTR__MallocV_01133bf0;
  in_RDI[0x10] = 0;
  in_RDI[0x11] = 0;
  in_RDI[0x12] = in_R9;
  in_RDI[0x13] = in_XMM0_Qa;
  return;
}

Assistant:

MallocV::MallocV(const std::string type, const bool AlwaysCopy, const size_t MemAlign,
                 const size_t MemBlockSize, size_t InitialBufferSize, double GrowthFactor)
: BufferV(type, AlwaysCopy, MemAlign, MemBlockSize), m_InitialBufferSize(InitialBufferSize),
  m_GrowthFactor(GrowthFactor)
{
}